

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomReporter.cpp
# Opt level: O0

shared_ptr<ApprovalTests::GenericDiffReporter>
ApprovalTests::CustomReporter::createForegroundReporter
          (string *path,Type type,bool allowNonZeroExitCodes)

{
  byte in_CL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  shared_ptr<ApprovalTests::GenericDiffReporter> sVar1;
  bool in_stack_0000004b;
  Type in_stack_0000004c;
  string *in_stack_00000050;
  string *in_stack_00000058;
  string local_58 [32];
  string local_38 [35];
  byte local_15;
  
  local_15 = in_CL & 1;
  ::std::__cxx11::string::string(local_38,in_RSI);
  DiffInfo::getDefaultArguments_abi_cxx11_();
  createForegroundReporter(in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_0000004b);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string(local_38);
  sVar1.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<ApprovalTests::GenericDiffReporter>)
         sVar1.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenericDiffReporter> CustomReporter::createForegroundReporter(
        std::string path, Type type, bool allowNonZeroExitCodes)
    {
        return createForegroundReporter(std::move(path),
                                        DiffInfo::getDefaultArguments(),
                                        type,
                                        allowNonZeroExitCodes);
    }